

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP.h
# Opt level: O0

void __thiscall CCDPP::predict_test_data(CCDPP *this)

{
  string *in_stack_000000c0;
  vector<Rating,_std::allocator<Rating>_> *in_stack_000000c8;
  CCDPP *in_stack_000000d0;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"RMSE of testing data: ",&local_29);
  predict(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return;
}

Assistant:

void predict_test_data() {
        predict(test_ratings, "RMSE of testing data: ");
    }